

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::continue_statement::~continue_statement(continue_statement *this)

{
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__continue_statement_001ca720;
  std::__cxx11::wstring::~wstring((wstring *)&this->id_);
  syntax_node::~syntax_node((syntax_node *)this);
  return;
}

Assistant:

statement_type type() const override { return statement_type::continue_; }